

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

void __thiscall
presolve::HPresolve::shrinkProblem(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  value_type vVar1;
  double dVar2;
  value_type vVar3;
  value_type vVar4;
  int iVar5;
  value_type vVar6;
  long lVar7;
  anon_class_16_2_ff4b0681 __f;
  _Rb_tree_const_iterator<int> __last;
  _Rb_tree_const_iterator<int> __last_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  bool bVar8;
  size_type sVar9;
  reference pvVar10;
  reference pvVar11;
  reference pvVar12;
  reference pvVar13;
  reference pvVar14;
  reference pvVar15;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var16;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var17;
  iterator orig2reducedcol;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var18;
  iterator other;
  reference ppVar19;
  iterator iVar20;
  iterator iVar21;
  HighsConflictPool *this_00;
  reference pvVar22;
  pointer pHVar23;
  reference pvVar24;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_RSI;
  long *in_RDI;
  anon_class_16_2_ff4b0681 aVar25;
  anon_class_16_2_0963f9a7 aVar26;
  pair<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_bool> pVar27;
  HighsInt i_8;
  HighsInt i_7;
  pair<int,_int> *rowColPair;
  iterator __end1_4;
  iterator __begin1_4;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range1_4;
  HighsInt *chgRow;
  iterator __end1_3;
  iterator __begin1_3;
  vector<int,_std::allocator<int>_> *__range1_3;
  HighsInt *singRow;
  iterator __end1_2;
  iterator __begin1_2;
  vector<int,_std::allocator<int>_> *__range1_2;
  HighsInt *chgCol;
  iterator __end1_1;
  iterator __begin1_1;
  vector<int,_std::allocator<int>_> *__range1_1;
  HighsInt *singCol;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  HighsInt i_6;
  HighsInt numNnz;
  set<int,_std::less<int>,_std::allocator<int>_> newSet_1;
  HighsInt i_5;
  set<int,_std::less<int>,_std::allocator<int>_> newSet;
  HighsInt i_4;
  HighsInt i_3;
  HighsInt i_2;
  HighsInt i_1;
  vector<int,_std::allocator<int>_> newRowIndex;
  bool have_row_names;
  HighsInt oldNumRow;
  HighsInt i;
  bool have_col_names;
  vector<int,_std::allocator<int>_> newColIndex;
  HighsInt oldNumCol;
  HighsCutPool *in_stack_fffffffffffff208;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *this_01;
  undefined6 in_stack_fffffffffffff210;
  undefined2 in_stack_fffffffffffff216;
  value_type vVar28;
  _Rb_tree_const_iterator<int> in_stack_fffffffffffff218;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff220;
  undefined4 in_stack_fffffffffffff228;
  undefined4 in_stack_fffffffffffff22c;
  undefined4 uVar29;
  const_iterator in_stack_fffffffffffff230;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *this_02;
  const_iterator in_stack_fffffffffffff238;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff260;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff268;
  long *plVar30;
  HighsPostsolveStack *in_stack_fffffffffffff270;
  HighsCutPool *this_03;
  undefined8 in_stack_fffffffffffff290;
  HighsInt HVar31;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff298;
  HighsLinearSumBounds *in_stack_fffffffffffff2a0;
  HighsDomain *this_04;
  long *plVar32;
  value_type in_stack_fffffffffffff2f0;
  value_type in_stack_fffffffffffff2f4;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_fffffffffffff328;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff330;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff498;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff4a0;
  HighsDomain *in_stack_fffffffffffff4a8;
  HighsPostsolveStack *in_stack_fffffffffffff4b0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff4b8;
  HighsInt ncols;
  HighsCliqueTable *in_stack_fffffffffffff4c0;
  int local_aac;
  int local_34c;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_2f0;
  long *local_2e8;
  int *local_2e0;
  int *local_2d8;
  undefined4 local_2c4;
  int *local_2c0;
  int *local_2b8;
  int *local_2b0;
  reference local_2a0;
  int *local_298;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_290;
  long *local_288;
  int *local_280;
  int *local_278;
  undefined4 local_264;
  int *local_260;
  int *local_258;
  int *local_250;
  reference local_240;
  int *local_238;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_230;
  long *local_228;
  int *local_220;
  int *local_218;
  undefined4 local_204;
  int *local_200;
  int *local_1f8;
  int *local_1f0;
  reference local_1e0;
  int *local_1d8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1d0;
  long *local_1c8;
  int *local_1c0;
  int *local_1b8;
  undefined4 local_1a4;
  int *local_1a0;
  int *local_198;
  int *local_190;
  reference local_180;
  int *local_178;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_170;
  long *local_168;
  int local_15c;
  int local_158;
  undefined1 local_151;
  anon_class_16_2_0963f9a7 local_150;
  vector<int,_std::allocator<int>_> *local_140;
  undefined1 *local_138;
  _Base_ptr local_130;
  _Base_ptr local_128;
  undefined1 local_120 [52];
  int local_ec;
  anon_class_16_2_ff4b0681 local_e8;
  vector<int,_std::allocator<int>_> *local_d8;
  undefined1 *local_d0;
  _Base_ptr local_c8;
  _Base_ptr local_c0;
  undefined1 local_b8 [52];
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  vector<int,_std::allocator<int>_> local_70;
  byte local_55;
  int local_54;
  undefined1 local_4d;
  int local_4c;
  byte local_45;
  vector<int,_std::allocator<int>_> local_30;
  int local_14;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_10;
  
  local_14 = *(int *)*in_RDI;
  *(undefined4 *)*in_RDI = 0;
  local_10 = in_RSI;
  std::allocator<int>::allocator((allocator<int> *)0x6f19e1);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff230._M_current,
             CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228),
             (allocator_type *)in_stack_fffffffffffff220._M_current);
  std::allocator<int>::~allocator((allocator<int> *)0x6f1a0d);
  sVar9 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(*in_RDI + 0x148));
  local_45 = sVar9 != 0;
  for (local_4c = 0; local_4c != local_14; local_4c = local_4c + 1) {
    pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0xbc),
                         (long)local_4c);
    if (*pvVar10 == '\0') {
      iVar5 = *(int *)*in_RDI;
      *(int *)*in_RDI = iVar5 + 1;
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)local_4c);
      *pvVar11 = iVar5;
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)local_4c);
      if (*pvVar11 < local_4c) {
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_RDI + 8),(long)local_4c
                            );
        in_stack_fffffffffffff4a0 = (vector<int,_std::allocator<int>_> *)*pvVar12;
        in_stack_fffffffffffff498 = (vector<double,_std::allocator<double>_> *)(*in_RDI + 8);
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)local_4c);
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            (in_stack_fffffffffffff498,(long)*pvVar11);
        *pvVar12 = (value_type)in_stack_fffffffffffff4a0;
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20),
                             (long)local_4c);
        in_stack_fffffffffffff4b0 = (HighsPostsolveStack *)*pvVar12;
        in_stack_fffffffffffff4a8 = (HighsDomain *)(*in_RDI + 0x20);
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)local_4c);
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff4a8,
                             (long)*pvVar11);
        *pvVar12 = (value_type)in_stack_fffffffffffff4b0;
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38),
                             (long)local_4c);
        in_stack_fffffffffffff4c0 = (HighsCliqueTable *)*pvVar12;
        in_stack_fffffffffffff4b8 = (vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38);
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)local_4c);
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            (in_stack_fffffffffffff4b8,(long)*pvVar11);
        *pvVar12 = (value_type)in_stack_fffffffffffff4c0;
        pvVar13 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                            ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
                             (*in_RDI + 0x178),(long)local_4c);
        vVar3 = *pvVar13;
        lVar7 = *in_RDI;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)local_4c);
        pvVar13 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                            ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(lVar7 + 0x178),
                             (long)*pvVar11);
        *pvVar13 = vVar3;
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x32),
                             (long)local_4c);
        vVar1 = *pvVar12;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)local_4c);
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x32),
                             (long)*pvVar11);
        *pvVar12 = vVar1;
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x35),
                             (long)local_4c);
        vVar1 = *pvVar12;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)local_4c);
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x35),
                             (long)*pvVar11);
        *pvVar12 = vVar1;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x38),(long)local_4c);
        vVar6 = *pvVar11;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)local_4c);
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x38),(long)*pvVar11);
        *pvVar11 = vVar6;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x3b),(long)local_4c);
        vVar6 = *pvVar11;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)local_4c);
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x3b),(long)*pvVar11);
        *pvVar11 = vVar6;
        std::
        vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
        ::operator[]((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                      *)(in_RDI + 0x53),(long)local_4c);
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)local_4c);
        std::
        vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
        ::operator[]((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                      *)(in_RDI + 0x53),(long)*pvVar11);
        std::set<int,_std::less<int>,_std::allocator<int>_>::operator=
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)
                   CONCAT26(in_stack_fffffffffffff216,in_stack_fffffffffffff210),
                   (set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff208);
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe),(long)local_4c);
        vVar6 = *pvVar11;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)local_4c);
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe),(long)*pvVar11);
        *pvVar11 = vVar6;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x29),(long)local_4c);
        vVar6 = *pvVar11;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)local_4c);
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x29),(long)*pvVar11);
        *pvVar11 = vVar6;
        if ((local_45 & 1) != 0) {
          pvVar14 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)(*in_RDI + 0x148),(long)local_4c);
          lVar7 = *in_RDI;
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)local_4c);
          pvVar15 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)(lVar7 + 0x148),(long)*pvVar11);
          std::__cxx11::string::operator=((string *)pvVar15,(string *)pvVar14);
        }
        pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             (in_RDI + 0x9b),(long)local_4c);
        vVar4 = *pvVar10;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)local_4c);
        pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             (in_RDI + 0x9b),(long)*pvVar11);
        *pvVar10 = vVar4;
      }
    }
    else {
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)local_4c);
      *pvVar11 = -1;
    }
  }
  local_4d = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::assign
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT26(in_stack_fffffffffffff216,in_stack_fffffffffffff210),
             (size_type)in_stack_fffffffffffff208,(value_type_conflict5 *)0x6f20fd);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff230._M_current,
             CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff230._M_current,
             CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff230._M_current,
             CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::resize
            ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
             in_stack_fffffffffffff230._M_current,
             CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff230._M_current,
             CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff230._M_current,
             CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff230._M_current,
             CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff230._M_current,
             CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  std::
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  ::resize((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
            *)in_stack_fffffffffffff230._M_current,
           CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff230._M_current,
             CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff230._M_current,
             CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  if ((local_45 & 1) != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff230._M_current,
             CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             in_stack_fffffffffffff230._M_current,
             CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  *(undefined4 *)((long)in_RDI + 0x624) = 0;
  local_54 = *(int *)(*in_RDI + 4);
  sVar9 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(*in_RDI + 0x160));
  local_55 = sVar9 != 0;
  *(undefined4 *)(*in_RDI + 4) = 0;
  std::allocator<int>::allocator((allocator<int> *)0x6f2305);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff230._M_current,
             CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228),
             (allocator_type *)in_stack_fffffffffffff220._M_current);
  std::allocator<int>::~allocator((allocator<int> *)0x6f2331);
  for (local_78 = 0; local_78 != local_54; local_78 = local_78 + 1) {
    pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0xb9),
                         (long)local_78);
    if (*pvVar10 == '\0') {
      iVar5 = *(int *)(*in_RDI + 4);
      *(int *)(*in_RDI + 4) = iVar5 + 1;
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,(long)local_78);
      *pvVar11 = iVar5;
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,(long)local_78);
      if (*pvVar11 < local_78) {
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x50),
                             (long)local_78);
        vVar1 = *pvVar12;
        lVar7 = *in_RDI;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,(long)local_78);
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(lVar7 + 0x50),
                             (long)*pvVar11);
        *pvVar12 = vVar1;
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x68),
                             (long)local_78);
        vVar1 = *pvVar12;
        lVar7 = *in_RDI;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,(long)local_78);
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(lVar7 + 0x68),
                             (long)*pvVar11);
        *pvVar12 = vVar1;
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x3e),
                             (long)local_78);
        vVar1 = *pvVar12;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,(long)local_78);
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x3e),
                             (long)*pvVar11);
        *pvVar12 = vVar1;
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x41),
                             (long)local_78);
        vVar1 = *pvVar12;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,(long)local_78);
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x41),
                             (long)*pvVar11);
        *pvVar12 = vVar1;
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x44),
                             (long)local_78);
        vVar1 = *pvVar12;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,(long)local_78);
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x44),
                             (long)*pvVar11);
        *pvVar12 = vVar1;
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x47),
                             (long)local_78);
        vVar1 = *pvVar12;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,(long)local_78);
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x47),
                             (long)*pvVar11);
        *pvVar12 = vVar1;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4a),(long)local_78);
        vVar6 = *pvVar11;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,(long)local_78);
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4a),(long)*pvVar11);
        *pvVar11 = vVar6;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4d),(long)local_78);
        vVar6 = *pvVar11;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,(long)local_78);
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4d),(long)*pvVar11);
        *pvVar11 = vVar6;
        std::
        vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
        ::operator[]((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                      *)(in_RDI + 0x50),(long)local_78);
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,(long)local_78);
        std::
        vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
        ::operator[]((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                      *)(in_RDI + 0x50),(long)*pvVar11);
        std::set<int,_std::less<int>,_std::allocator<int>_>::operator=
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)
                   CONCAT26(in_stack_fffffffffffff216,in_stack_fffffffffffff210),
                   (set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff208);
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x17),(long)local_78);
        vVar6 = *pvVar11;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,(long)local_78);
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x17),(long)*pvVar11);
        *pvVar11 = vVar6;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)local_78);
        vVar6 = *pvVar11;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,(long)local_78);
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)*pvVar11);
        *pvVar11 = vVar6;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x23),(long)local_78);
        vVar6 = *pvVar11;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,(long)local_78);
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x23),(long)*pvVar11);
        *pvVar11 = vVar6;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x26),(long)local_78);
        vVar6 = *pvVar11;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,(long)local_78);
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x26),(long)*pvVar11);
        *pvVar11 = vVar6;
        if ((local_55 & 1) != 0) {
          pvVar14 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)(*in_RDI + 0x160),(long)local_78);
          lVar7 = *in_RDI;
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,(long)local_78);
          pvVar15 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)(lVar7 + 0x160),(long)*pvVar11);
          std::__cxx11::string::operator=((string *)pvVar15,(string *)pvVar14);
        }
        pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             (in_RDI + 0x95),(long)local_78);
        vVar4 = *pvVar10;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,(long)local_78);
        pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             (in_RDI + 0x95),(long)*pvVar11);
        *pvVar10 = vVar4;
      }
    }
    else {
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,(long)local_78);
      *pvVar11 = -1;
    }
  }
  for (local_7c = 0; local_7c != *(int *)*in_RDI; local_7c = local_7c + 1) {
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x38),(long)local_7c);
    if (*pvVar11 != -1) {
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x38),(long)local_7c);
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,(long)*pvVar11);
      vVar6 = *pvVar11;
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x38),(long)local_7c);
      *pvVar11 = vVar6;
    }
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x3b),(long)local_7c);
    if (*pvVar11 != -1) {
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x3b),(long)local_7c);
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,(long)*pvVar11);
      vVar6 = *pvVar11;
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x3b),(long)local_7c);
      *pvVar11 = vVar6;
    }
  }
  local_80 = 0;
  while( true ) {
    aVar25.newSet = in_stack_fffffffffffff328;
    aVar25.newRowIndex = in_stack_fffffffffffff330;
    if (local_80 == *(int *)(*in_RDI + 4)) break;
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4a),(long)local_80);
    if (*pvVar11 != -1) {
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4a),(long)local_80);
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)*pvVar11);
      vVar6 = *pvVar11;
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4a),(long)local_80);
      *pvVar11 = vVar6;
    }
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4d),(long)local_80);
    if (*pvVar11 != -1) {
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4d),(long)local_80);
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)*pvVar11);
      vVar6 = *pvVar11;
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4d),(long)local_80);
      *pvVar11 = vVar6;
    }
    local_80 = local_80 + 1;
  }
  for (local_84 = 0; local_84 != *(int *)*in_RDI; local_84 = local_84 + 1) {
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)0x6f2d26);
    std::
    vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::operator[]((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  *)(in_RDI + 0x53),(long)local_84);
    local_c0 = (_Base_ptr)
               std::set<int,_std::less<int>,_std::allocator<int>_>::cbegin
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)
                          in_stack_fffffffffffff208);
    std::
    vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::operator[]((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  *)(in_RDI + 0x53),(long)local_84);
    local_c8 = (_Base_ptr)
               std::set<int,_std::less<int>,_std::allocator<int>_>::cend
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)
                          in_stack_fffffffffffff208);
    local_d8 = &local_70;
    __last._M_node._6_2_ = in_stack_fffffffffffff216;
    __last._M_node._0_6_ = in_stack_fffffffffffff210;
    __f.newSet = (set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff208;
    __f.newRowIndex = (vector<int,_std::allocator<int>_> *)0x6f2dc7;
    local_d0 = local_b8;
    aVar25 = std::
             for_each<std::_Rb_tree_const_iterator<int>,presolve::HPresolve::shrinkProblem(presolve::HighsPostsolveStack&)::__0>
                       (in_stack_fffffffffffff218,__last,__f);
    local_e8 = aVar25;
    std::
    vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::operator[]((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  *)(in_RDI + 0x53),(long)local_84);
    std::set<int,_std::less<int>,_std::allocator<int>_>::operator=
              ((set<int,_std::less<int>,_std::allocator<int>_> *)
               CONCAT26(in_stack_fffffffffffff216,in_stack_fffffffffffff210),
               (set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff208);
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)0x6f2e32);
  }
  for (local_ec = 0; HVar31 = (HighsInt)((ulong)in_stack_fffffffffffff290 >> 0x20),
      local_ec != *(int *)(*in_RDI + 4); local_ec = local_ec + 1) {
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)0x6f2ea9);
    std::
    vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::operator[]((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  *)(in_RDI + 0x50),(long)local_ec);
    local_128 = (_Base_ptr)
                std::set<int,_std::less<int>,_std::allocator<int>_>::cbegin
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)
                           in_stack_fffffffffffff208);
    std::
    vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::operator[]((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  *)(in_RDI + 0x50),(long)local_ec);
    local_130 = (_Base_ptr)
                std::set<int,_std::less<int>,_std::allocator<int>_>::cend
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)
                           in_stack_fffffffffffff208);
    local_140 = &local_30;
    __last_00._M_node._6_2_ = in_stack_fffffffffffff216;
    __last_00._M_node._0_6_ = in_stack_fffffffffffff210;
    aVar26.newSet = (set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff208;
    aVar26.newColIndex = (vector<int,_std::allocator<int>_> *)0x6f2f4a;
    local_138 = local_120;
    aVar26 = std::
             for_each<std::_Rb_tree_const_iterator<int>,presolve::HPresolve::shrinkProblem(presolve::HighsPostsolveStack&)::__1>
                       (in_stack_fffffffffffff218,__last_00,aVar26);
    local_150 = aVar26;
    std::
    vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::operator[]((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  *)(in_RDI + 0x50),(long)local_ec);
    std::set<int,_std::less<int>,_std::allocator<int>_>::operator=
              ((set<int,_std::less<int>,_std::allocator<int>_> *)
               CONCAT26(in_stack_fffffffffffff216,in_stack_fffffffffffff210),
               (set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff208);
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)0x6f2fb5);
  }
  local_151 = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::assign
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT26(in_stack_fffffffffffff216,in_stack_fffffffffffff210),
             (size_type)in_stack_fffffffffffff208,(value_type_conflict5 *)0x6f301f);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff230._M_current,
             CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff230._M_current,
             CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff230._M_current,
             CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff230._M_current,
             CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff230._M_current,
             CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff230._M_current,
             CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff230._M_current,
             CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff230._M_current,
             CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  std::
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  ::resize((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
            *)in_stack_fffffffffffff230._M_current,
           CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff230._M_current,
             CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff230._M_current,
             CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff230._M_current,
             CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff230._M_current,
             CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  if ((local_55 & 1) != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff230._M_current,
             CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             in_stack_fffffffffffff230._M_current,
             CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228));
  *(undefined4 *)(in_RDI + 0xc4) = 0;
  HighsPostsolveStack::compressIndexMaps
            (in_stack_fffffffffffff270,in_stack_fffffffffffff268,in_stack_fffffffffffff260);
  HighsLinearSumBounds::shrink(in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,HVar31);
  HighsLinearSumBounds::shrink(in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,HVar31);
  sVar9 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 5));
  local_158 = (int)sVar9;
  for (local_15c = 0; local_15c != local_158; local_15c = local_15c + 1) {
    pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 5),(long)local_15c);
    if ((*pvVar12 != 0.0) || (NAN(*pvVar12))) {
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xb),(long)local_15c);
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)*pvVar11);
      in_stack_fffffffffffff2f0 = *pvVar11;
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xb),(long)local_15c);
      *pvVar11 = in_stack_fffffffffffff2f0;
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)local_15c);
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,(long)*pvVar11);
      in_stack_fffffffffffff2f4 = *pvVar11;
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)local_15c);
      *pvVar11 = in_stack_fffffffffffff2f4;
    }
  }
  local_168 = in_RDI + 0xb6;
  local_170._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff208);
  local_178 = (int *)std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff208);
  while( true ) {
    bVar8 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT26(in_stack_fffffffffffff216,in_stack_fffffffffffff210),
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffff208);
    if (!bVar8) break;
    local_180 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&local_170);
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)*local_180);
    *local_180 = *pvVar11;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_170);
  }
  local_198 = (int *)std::vector<int,_std::allocator<int>_>::begin
                               ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff208);
  local_1a0 = (int *)std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff208);
  local_1a4 = 0xffffffff;
  _Var16._M_current._4_4_ = in_stack_fffffffffffff22c;
  _Var16._M_current._0_4_ = in_stack_fffffffffffff228;
  _Var16 = std::remove<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                     (_Var16,in_stack_fffffffffffff220,(int *)in_stack_fffffffffffff218._M_node);
  local_190 = _Var16._M_current;
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
             CONCAT26(in_stack_fffffffffffff216,in_stack_fffffffffffff210),
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             in_stack_fffffffffffff208);
  local_1b8 = (int *)std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff208);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
             CONCAT26(in_stack_fffffffffffff216,in_stack_fffffffffffff210),
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             in_stack_fffffffffffff208);
  local_1c0 = (int *)std::vector<int,_std::allocator<int>_>::erase
                               ((vector<int,_std::allocator<int>_> *)
                                CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228),
                                (const_iterator)in_stack_fffffffffffff238._M_current,
                                (const_iterator)in_stack_fffffffffffff230._M_current);
  local_1c8 = in_RDI + 0x98;
  local_1d0._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff208);
  local_1d8 = (int *)std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff208);
  while( true ) {
    bVar8 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT26(in_stack_fffffffffffff216,in_stack_fffffffffffff210),
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffff208);
    if (!bVar8) break;
    local_1e0 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&local_1d0);
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)*local_1e0);
    *local_1e0 = *pvVar11;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_1d0);
  }
  plVar32 = in_RDI + 0x98;
  local_1f8 = (int *)std::vector<int,_std::allocator<int>_>::begin
                               ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff208);
  local_200 = (int *)std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff208);
  local_204 = 0xffffffff;
  _Var17._M_current._4_4_ = in_stack_fffffffffffff22c;
  _Var17._M_current._0_4_ = in_stack_fffffffffffff228;
  _Var17 = std::remove<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                     (_Var17,in_stack_fffffffffffff220,(int *)in_stack_fffffffffffff218._M_node);
  local_1f0 = _Var17._M_current;
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
             CONCAT26(in_stack_fffffffffffff216,in_stack_fffffffffffff210),
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             in_stack_fffffffffffff208);
  local_218 = (int *)std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff208);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
             CONCAT26(in_stack_fffffffffffff216,in_stack_fffffffffffff210),
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             in_stack_fffffffffffff208);
  orig2reducedcol =
       std::vector<int,_std::allocator<int>_>::erase
                 ((vector<int,_std::allocator<int>_> *)
                  CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228),
                  (const_iterator)in_stack_fffffffffffff238._M_current,
                  (const_iterator)in_stack_fffffffffffff230._M_current);
  local_228 = in_RDI + 0xb3;
  local_220 = orig2reducedcol._M_current;
  local_230._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff208);
  local_238 = (int *)std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff208);
  while( true ) {
    bVar8 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT26(in_stack_fffffffffffff216,in_stack_fffffffffffff210),
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffff208);
    if (!bVar8) break;
    local_240 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&local_230);
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,(long)*local_240);
    *local_240 = *pvVar11;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_230);
  }
  this_04 = (HighsDomain *)(in_RDI + 0xb3);
  local_258 = (int *)std::vector<int,_std::allocator<int>_>::begin
                               ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff208);
  local_260 = (int *)std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff208);
  local_264 = 0xffffffff;
  _Var18._M_current._4_4_ = in_stack_fffffffffffff22c;
  _Var18._M_current._0_4_ = in_stack_fffffffffffff228;
  _Var18 = std::remove<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                     (_Var18,in_stack_fffffffffffff220,(int *)in_stack_fffffffffffff218._M_node);
  local_250 = _Var18._M_current;
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
             CONCAT26(in_stack_fffffffffffff216,in_stack_fffffffffffff210),
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             in_stack_fffffffffffff208);
  local_278 = (int *)std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff208);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
             CONCAT26(in_stack_fffffffffffff216,in_stack_fffffffffffff210),
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             in_stack_fffffffffffff208);
  other = std::vector<int,_std::allocator<int>_>::erase
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228),
                     (const_iterator)in_stack_fffffffffffff238._M_current,
                     (const_iterator)in_stack_fffffffffffff230._M_current);
  local_288 = in_RDI + 0x92;
  local_280 = other._M_current;
  local_290._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff208);
  local_298 = (int *)std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff208);
  while( true ) {
    bVar8 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT26(in_stack_fffffffffffff216,in_stack_fffffffffffff210),
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffff208);
    if (!bVar8) break;
    local_2a0 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&local_290);
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,(long)*local_2a0);
    *local_2a0 = *pvVar11;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_290);
  }
  local_2b8 = (int *)std::vector<int,_std::allocator<int>_>::begin
                               ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff208);
  local_2c0 = (int *)std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff208);
  local_2c4 = 0xffffffff;
  __first._M_current._4_4_ = in_stack_fffffffffffff22c;
  __first._M_current._0_4_ = in_stack_fffffffffffff228;
  local_2b0 = (int *)std::
                     remove<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                               (__first,in_stack_fffffffffffff220,
                                (int *)in_stack_fffffffffffff218._M_node);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
             CONCAT26(in_stack_fffffffffffff216,in_stack_fffffffffffff210),
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             in_stack_fffffffffffff208);
  local_2d8 = (int *)std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff208);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
             CONCAT26(in_stack_fffffffffffff216,in_stack_fffffffffffff210),
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             in_stack_fffffffffffff208);
  local_2e0 = (int *)std::vector<int,_std::allocator<int>_>::erase
                               ((vector<int,_std::allocator<int>_> *)
                                CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228),
                                (const_iterator)in_stack_fffffffffffff238._M_current,
                                (const_iterator)in_stack_fffffffffffff230._M_current);
  local_2e8 = in_RDI + 0x9e;
  local_2f0._M_current =
       (pair<int,_int> *)
       std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                 ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                  in_stack_fffffffffffff208);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             in_stack_fffffffffffff208);
  while( true ) {
    bVar8 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                        *)CONCAT26(in_stack_fffffffffffff216,in_stack_fffffffffffff210),
                       (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                        *)in_stack_fffffffffffff208);
    if (!bVar8) break;
    ppVar19 = __gnu_cxx::
              __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              ::operator*(&local_2f0);
    if (ppVar19->first != -1) {
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,(long)ppVar19->first);
      ppVar19->first = *pvVar11;
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)ppVar19->second);
      ppVar19->second = *pvVar11;
    }
    __gnu_cxx::
    __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator++(&local_2f0);
  }
  this_03 = (HighsCutPool *)(in_RDI + 0x9e);
  iVar20 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                      in_stack_fffffffffffff208);
  iVar21 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                      in_stack_fffffffffffff208);
  std::
  remove_if<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::shrinkProblem(presolve::HighsPostsolveStack&)::__2>
            (iVar20._M_current,iVar21._M_current);
  __gnu_cxx::
  __normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
  ::__normal_iterator<std::pair<int,int>*>
            ((__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              *)CONCAT26(in_stack_fffffffffffff216,in_stack_fffffffffffff210),
             (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              *)in_stack_fffffffffffff208);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             in_stack_fffffffffffff208);
  __gnu_cxx::
  __normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
  ::__normal_iterator<std::pair<int,int>*>
            ((__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              *)CONCAT26(in_stack_fffffffffffff216,in_stack_fffffffffffff210),
             (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              *)in_stack_fffffffffffff208);
  iVar20 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::erase
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                      CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228),
                      in_stack_fffffffffffff238,in_stack_fffffffffffff230);
  std::
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>::
  clear((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
         *)0x6f3be0);
  plVar30 = in_RDI + 0xae;
  this_00 = (HighsConflictPool *)(long)*(int *)(*in_RDI + 4);
  std::
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>::
  end((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
       *)in_stack_fffffffffffff208);
  std::
  vector<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
  ::assign((vector<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
            *)CONCAT26(in_stack_fffffffffffff216,in_stack_fffffffffffff210),
           (size_type)in_stack_fffffffffffff208,(value_type *)0x6f3c2c);
  local_34c = 0;
  while( true ) {
    HVar31 = (HighsInt)((ulong)plVar32 >> 0x20);
    ncols = (HighsInt)((ulong)in_stack_fffffffffffff4b8 >> 0x20);
    if (local_34c == *(int *)(*in_RDI + 4)) break;
    pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x50),(long)local_34c
                        );
    dVar2 = *pvVar12;
    pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x68),(long)local_34c
                        );
    if ((dVar2 == *pvVar12) && (!NAN(dVar2) && !NAN(*pvVar12))) {
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),(long)local_34c);
      pVar27 = std::
               set<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
               ::emplace<int&,int&>
                         ((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                           *)in_stack_fffffffffffff230._M_current,
                          (int *)CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228),
                          in_stack_fffffffffffff220._M_current);
      pvVar22 = std::
                vector<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
                ::operator[]((vector<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
                              *)(in_RDI + 0xae),(long)local_34c);
      pvVar22->_M_node = pVar27.first._M_node._M_node;
    }
    local_34c = local_34c + 1;
  }
  if (in_RDI[3] != 0) {
    pHVar23 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
              operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *
                         )0x6f3d99);
    pHVar23->rowMatrixSet = false;
    HighsObjectiveFunction::HighsObjectiveFunction
              ((HighsObjectiveFunction *)
               CONCAT44(in_stack_fffffffffffff2f4,in_stack_fffffffffffff2f0),
               (HighsMipSolver *)_Var16._M_current);
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x6f3dd6)
    ;
    HighsObjectiveFunction::operator=
              ((HighsObjectiveFunction *)
               CONCAT26(in_stack_fffffffffffff216,in_stack_fffffffffffff210),
               (HighsObjectiveFunction *)in_stack_fffffffffffff208);
    HighsObjectiveFunction::~HighsObjectiveFunction
              ((HighsObjectiveFunction *)
               CONCAT26(in_stack_fffffffffffff216,in_stack_fffffffffffff210));
    HighsDomain::HighsDomain((HighsDomain *)aVar25.newRowIndex,(HighsMipSolver *)aVar25.newSet);
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x6f3e2f)
    ;
    HighsDomain::operator=(this_04,(HighsDomain *)other._M_current);
    HighsDomain::~HighsDomain
              ((HighsDomain *)CONCAT26(in_stack_fffffffffffff216,in_stack_fffffffffffff210));
    pHVar23 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
              operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *
                         )0x6f3e6d);
    in_stack_fffffffffffff220._M_current = (int *)&pHVar23->cliquetable;
    uVar29 = *(undefined4 *)*in_RDI;
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x6f3ea6)
    ;
    HighsCliqueTable::rebuild
              (in_stack_fffffffffffff4c0,ncols,in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,
               in_stack_fffffffffffff4a0,
               (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff498);
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x6f3eed)
    ;
    HighsImplications::rebuild
              ((HighsImplications *)_Var17._M_current,HVar31,
               (vector<int,_std::allocator<int>_> *)orig2reducedcol._M_current,
               (vector<int,_std::allocator<int>_> *)_Var18._M_current);
    HighsCutPool::HighsCutPool
              (this_03,(HighsInt)((ulong)iVar20._M_current >> 0x20),(HighsInt)iVar20._M_current,
               (HighsInt)((ulong)this_00 >> 0x20));
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x6f3f64)
    ;
    HighsCutPool::operator=
              ((HighsCutPool *)CONCAT26(in_stack_fffffffffffff216,in_stack_fffffffffffff210),
               in_stack_fffffffffffff208);
    HighsCutPool::~HighsCutPool
              ((HighsCutPool *)CONCAT26(in_stack_fffffffffffff216,in_stack_fffffffffffff210));
    HighsConflictPool::HighsConflictPool
              (this_00,(HighsInt)((ulong)plVar30 >> 0x20),(HighsInt)plVar30);
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x6f3fcf)
    ;
    HighsConflictPool::operator=
              ((HighsConflictPool *)CONCAT26(in_stack_fffffffffffff216,in_stack_fffffffffffff210),
               (HighsConflictPool *)in_stack_fffffffffffff208);
    HighsConflictPool::~HighsConflictPool
              ((HighsConflictPool *)CONCAT26(in_stack_fffffffffffff216,in_stack_fffffffffffff210));
    this_02 = local_10;
    for (local_aac = 0; local_aac != local_14; local_aac = local_aac + 1) {
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)local_aac);
      if (*pvVar11 != -1) {
        pvVar24 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                             (in_RDI + 0xbf),(long)local_aac);
        vVar28 = *pvVar24;
        this_01 = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 0xbf);
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)local_aac);
        pvVar24 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                            (this_01,(long)*pvVar11);
        *pvVar24 = vVar28;
      }
    }
    pHVar23 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
              operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *
                         )0x6f40ea);
    HighsDebugSol::shrink((HighsDebugSol *)&pHVar23->field_0x68b0,&local_30);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
              (this_02,CONCAT44(uVar29,in_stack_fffffffffffff228));
    HighsLp::setMatrixDimensions((HighsLp *)*in_RDI);
  }
  HighsLp::setMatrixDimensions((HighsLp *)*in_RDI);
  HPresolveAnalysis::resetNumDeleted((HPresolveAnalysis *)(in_RDI + 199));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff220._M_current);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff220._M_current);
  return;
}

Assistant:

void HPresolve::shrinkProblem(HighsPostsolveStack& postsolve_stack) {
  HighsInt oldNumCol = model->num_col_;
  model->num_col_ = 0;
  std::vector<HighsInt> newColIndex(oldNumCol);
  const bool have_col_names = model->col_names_.size() > 0;
  assert(!have_col_names ||
         model->col_names_.size() == static_cast<size_t>(oldNumCol));
  for (HighsInt i = 0; i != oldNumCol; ++i) {
    if (colDeleted[i])
      newColIndex[i] = -1;
    else {
      newColIndex[i] = model->num_col_++;
      if (newColIndex[i] < i) {
        model->col_cost_[newColIndex[i]] = model->col_cost_[i];
        model->col_lower_[newColIndex[i]] = model->col_lower_[i];
        model->col_upper_[newColIndex[i]] = model->col_upper_[i];
        assert(!std::isnan(model->col_lower_[newColIndex[i]]));
        assert(!std::isnan(model->col_upper_[newColIndex[i]]));
        model->integrality_[newColIndex[i]] = model->integrality_[i];
        implColLower[newColIndex[i]] = implColLower[i];
        implColUpper[newColIndex[i]] = implColUpper[i];
        colLowerSource[newColIndex[i]] = colLowerSource[i];
        colUpperSource[newColIndex[i]] = colUpperSource[i];
        implRowDualSourceByCol[newColIndex[i]] = implRowDualSourceByCol[i];
        colhead[newColIndex[i]] = colhead[i];
        colsize[newColIndex[i]] = colsize[i];
        if (have_col_names)
          model->col_names_[newColIndex[i]] = std::move(model->col_names_[i]);
        changedColFlag[newColIndex[i]] = changedColFlag[i];
      }
    }
  }
  colDeleted.assign(model->num_col_, false);
  model->col_cost_.resize(model->num_col_);
  model->col_lower_.resize(model->num_col_);
  model->col_upper_.resize(model->num_col_);
  model->integrality_.resize(model->num_col_);
  implColLower.resize(model->num_col_);
  implColUpper.resize(model->num_col_);
  colLowerSource.resize(model->num_col_);
  colUpperSource.resize(model->num_col_);
  implRowDualSourceByCol.resize(model->num_col_);
  colhead.resize(model->num_col_);
  colsize.resize(model->num_col_);
  if (have_col_names) model->col_names_.resize(model->num_col_);
  changedColFlag.resize(model->num_col_);
  numDeletedCols = 0;
  HighsInt oldNumRow = model->num_row_;
  const bool have_row_names = model->row_names_.size() > 0;
  assert(!have_row_names ||
         model->row_names_.size() == static_cast<size_t>(oldNumRow));
  model->num_row_ = 0;
  std::vector<HighsInt> newRowIndex(oldNumRow);
  for (HighsInt i = 0; i != oldNumRow; ++i) {
    if (rowDeleted[i])
      newRowIndex[i] = -1;
    else {
      newRowIndex[i] = model->num_row_++;
      if (newRowIndex[i] < i) {
        model->row_lower_[newRowIndex[i]] = model->row_lower_[i];
        model->row_upper_[newRowIndex[i]] = model->row_upper_[i];
        assert(!std::isnan(model->row_lower_[newRowIndex[i]]));
        assert(!std::isnan(model->row_upper_[newRowIndex[i]]));
        rowDualLower[newRowIndex[i]] = rowDualLower[i];
        rowDualUpper[newRowIndex[i]] = rowDualUpper[i];
        implRowDualLower[newRowIndex[i]] = implRowDualLower[i];
        implRowDualUpper[newRowIndex[i]] = implRowDualUpper[i];
        rowDualLowerSource[newRowIndex[i]] = rowDualLowerSource[i];
        rowDualUpperSource[newRowIndex[i]] = rowDualUpperSource[i];
        colImplSourceByRow[newRowIndex[i]] = colImplSourceByRow[i];
        rowroot[newRowIndex[i]] = rowroot[i];
        rowsize[newRowIndex[i]] = rowsize[i];
        rowsizeInteger[newRowIndex[i]] = rowsizeInteger[i];
        rowsizeImplInt[newRowIndex[i]] = rowsizeImplInt[i];
        if (have_row_names)
          model->row_names_[newRowIndex[i]] = std::move(model->row_names_[i]);
        changedRowFlag[newRowIndex[i]] = changedRowFlag[i];
      }
    }
  }
  for (HighsInt i = 0; i != model->num_col_; ++i) {
    if (colLowerSource[i] != -1)
      colLowerSource[i] = newRowIndex[colLowerSource[i]];
    if (colUpperSource[i] != -1)
      colUpperSource[i] = newRowIndex[colUpperSource[i]];
  }

  for (HighsInt i = 0; i != model->num_row_; ++i) {
    if (rowDualLowerSource[i] != -1)
      rowDualLowerSource[i] = newColIndex[rowDualLowerSource[i]];
    if (rowDualUpperSource[i] != -1)
      rowDualUpperSource[i] = newColIndex[rowDualUpperSource[i]];
  }

  for (HighsInt i = 0; i != model->num_col_; ++i) {
    std::set<HighsInt> newSet;
    std::for_each(implRowDualSourceByCol[i].cbegin(),
                  implRowDualSourceByCol[i].cend(), [&](const HighsInt& row) {
                    if (newRowIndex[row] != -1)
                      newSet.emplace(newRowIndex[row]);
                  });
    implRowDualSourceByCol[i] = std::move(newSet);
  }

  for (HighsInt i = 0; i != model->num_row_; ++i) {
    std::set<HighsInt> newSet;
    std::for_each(colImplSourceByRow[i].cbegin(), colImplSourceByRow[i].cend(),
                  [&](const HighsInt& col) {
                    if (newColIndex[col] != -1)
                      newSet.emplace(newColIndex[col]);
                  });
    colImplSourceByRow[i] = std::move(newSet);
  }
  rowDeleted.assign(model->num_row_, false);
  model->row_lower_.resize(model->num_row_);
  model->row_upper_.resize(model->num_row_);
  rowDualLower.resize(model->num_row_);
  rowDualUpper.resize(model->num_row_);
  implRowDualLower.resize(model->num_row_);
  implRowDualUpper.resize(model->num_row_);
  rowDualLowerSource.resize(model->num_row_);
  rowDualUpperSource.resize(model->num_row_);
  colImplSourceByRow.resize(model->num_row_);
  rowroot.resize(model->num_row_);
  rowsize.resize(model->num_row_);
  rowsizeInteger.resize(model->num_row_);
  rowsizeImplInt.resize(model->num_row_);
  if (have_row_names) model->row_names_.resize(model->num_row_);
  changedRowFlag.resize(model->num_row_);

  numDeletedRows = 0;
  postsolve_stack.compressIndexMaps(newRowIndex, newColIndex);
  impliedRowBounds.shrink(newRowIndex, model->num_row_);
  impliedDualRowBounds.shrink(newColIndex, model->num_col_);

  HighsInt numNnz = Avalue.size();
  for (HighsInt i = 0; i != numNnz; ++i) {
    if (Avalue[i] == 0) continue;
    assert(newColIndex[Acol[i]] != -1);
    assert(newRowIndex[Arow[i]] != -1);
    Acol[i] = newColIndex[Acol[i]];
    Arow[i] = newRowIndex[Arow[i]];
  }

  // update index sets
  for (HighsInt& singCol : singletonColumns) singCol = newColIndex[singCol];
  singletonColumns.erase(
      std::remove(singletonColumns.begin(), singletonColumns.end(), -1),
      singletonColumns.end());

  for (HighsInt& chgCol : changedColIndices) chgCol = newColIndex[chgCol];
  changedColIndices.erase(
      std::remove(changedColIndices.begin(), changedColIndices.end(), -1),
      changedColIndices.end());

  for (HighsInt& singRow : singletonRows) singRow = newRowIndex[singRow];
  singletonRows.erase(
      std::remove(singletonRows.begin(), singletonRows.end(), -1),
      singletonRows.end());

  for (HighsInt& chgRow : changedRowIndices) chgRow = newRowIndex[chgRow];
  changedRowIndices.erase(
      std::remove(changedRowIndices.begin(), changedRowIndices.end(), -1),
      changedRowIndices.end());

  for (auto& rowColPair : substitutionOpportunities) {
    // skip deleted elements
    if (rowColPair.first == -1) continue;
    rowColPair.first = newRowIndex[rowColPair.first];
    rowColPair.second = newColIndex[rowColPair.second];
  }
  substitutionOpportunities.erase(
      std::remove_if(substitutionOpportunities.begin(),
                     substitutionOpportunities.end(),
                     [&](const std::pair<HighsInt, HighsInt>& p) {
                       return p.first == -1 || p.second == -1;
                     }),
      substitutionOpportunities.end());

  // todo remove equation set and replace with a vector of doubleton eqs
  equations.clear();
  eqiters.assign(model->num_row_, equations.end());
  for (HighsInt i = 0; i != model->num_row_; ++i) {
    if (model->row_lower_[i] == model->row_upper_[i])
      eqiters[i] = equations.emplace(rowsize[i], i).first;
  }

  if (mipsolver != nullptr) {
    mipsolver->mipdata_->rowMatrixSet = false;
    mipsolver->mipdata_->objectiveFunction = HighsObjectiveFunction(*mipsolver);
    mipsolver->mipdata_->domain = HighsDomain(*mipsolver);
    mipsolver->mipdata_->cliquetable.rebuild(model->num_col_, postsolve_stack,
                                             mipsolver->mipdata_->domain,
                                             newColIndex, newRowIndex);
    mipsolver->mipdata_->implications.rebuild(model->num_col_, newColIndex,
                                              newRowIndex);
    mipsolver->mipdata_->cutpool =
        HighsCutPool(mipsolver->model_->num_col_,
                     mipsolver->options_mip_->mip_pool_age_limit,
                     mipsolver->options_mip_->mip_pool_soft_limit);
    mipsolver->mipdata_->conflictPool =
        HighsConflictPool(5 * mipsolver->options_mip_->mip_pool_age_limit,
                          mipsolver->options_mip_->mip_pool_soft_limit);

    for (HighsInt i = 0; i != oldNumCol; ++i)
      if (newColIndex[i] != -1) numProbes[newColIndex[i]] = numProbes[i];

    mipsolver->mipdata_->debugSolution.shrink(newColIndex);
    numProbes.resize(model->num_col_);
    // Need to set the constraint matrix dimensions
    model->setMatrixDimensions();
  }
  // Need to set the constraint matrix dimensions
  model->setMatrixDimensions();
  // Need to reset current number of deleted rows and columns in logging
  analysis_.resetNumDeleted();
}